

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushFocusScope(ImGuiID id)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  uint *puVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  uint *__dest;
  int iVar6;
  int iVar7;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  iVar5 = (GImGui->FocusScopeStack).Size;
  if (iVar5 == (GImGui->FocusScopeStack).Capacity) {
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    iVar7 = iVar5 + 1;
    if (iVar5 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar7 << 2,GImAllocatorUserData);
    puVar3 = (pIVar4->FocusScopeStack).Data;
    if (puVar3 != (uint *)0x0) {
      memcpy(__dest,puVar3,(long)(pIVar4->FocusScopeStack).Size << 2);
      puVar3 = (pIVar4->FocusScopeStack).Data;
      if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
    }
    (pIVar4->FocusScopeStack).Data = __dest;
    (pIVar4->FocusScopeStack).Capacity = iVar7;
    iVar5 = (pIVar4->FocusScopeStack).Size;
  }
  else {
    __dest = (GImGui->FocusScopeStack).Data;
  }
  __dest[iVar5] = (pIVar2->DC).NavFocusScopeIdCurrent;
  (pIVar4->FocusScopeStack).Size = (pIVar4->FocusScopeStack).Size + 1;
  (pIVar2->DC).NavFocusScopeIdCurrent = id;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    g.FocusScopeStack.push_back(window->DC.NavFocusScopeIdCurrent);
    window->DC.NavFocusScopeIdCurrent = id;
}